

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O2

double __thiscall COLLADABU::Math::Quaternion::exp(Quaternion *this,double __x)

{
  long in_RSI;
  double dVar1;
  double dVar2;
  double dVar3;
  Real RVar4;
  Real RVar5;
  
  dVar1 = SQRT(*(double *)(in_RSI + 0x18) * *(double *)(in_RSI + 0x18) +
               *(double *)(in_RSI + 8) * *(double *)(in_RSI + 8) +
               *(double *)(in_RSI + 0x10) * *(double *)(in_RSI + 0x10));
  dVar2 = sin(dVar1);
  dVar3 = cos(dVar1);
  this->w = dVar3;
  if (0.001 <= ABS(dVar2)) {
    dVar2 = dVar2 / dVar1;
    dVar1 = dVar2 * *(double *)(in_RSI + 8);
    RVar4 = dVar2 * *(double *)(in_RSI + 0x10);
    RVar5 = dVar2 * *(double *)(in_RSI + 0x18);
  }
  else {
    dVar1 = *(double *)(in_RSI + 8);
    RVar4 = *(Real *)(in_RSI + 0x10);
    RVar5 = *(Real *)(in_RSI + 0x18);
  }
  this->x = dVar1;
  this->y = RVar4;
  this->z = RVar5;
  return dVar1;
}

Assistant:

Quaternion Quaternion::exp () const
        {
            // If q = A*(x*i+y*j+z*k) where (x,y,z) is unit length, then
            // exp(q) = cos(A)+sin(A)*(x*i+y*j+z*k).  If sin(A) is near zero,
            // use exp(q) = cos(A)+A*(x*i+y*j+z*k) since A/sin(A) has limit 1.

            Real fAngle_radian = sqrt( x * x + y * y + z * z );
            Real fSin = sin( fAngle_radian );

            Quaternion kResult;
            kResult.w = cos( fAngle_radian );

            if ( std::abs( fSin ) >= ms_fEpsilon )
            {
                Real fCoeff = fSin / fAngle_radian;
                kResult.x = fCoeff * x;
                kResult.y = fCoeff * y;
                kResult.z = fCoeff * z;
            }

            else
            {
                kResult.x = x;
                kResult.y = y;
                kResult.z = z;
            }

            return kResult;
        }